

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

void yaml_parser_set_input(yaml_parser_t *parser,yaml_read_handler_t *handler,void *data)

{
  if (parser == (yaml_parser_t *)0x0) {
    __assert_fail("parser",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x149,
                  "void yaml_parser_set_input(yaml_parser_t *, yaml_read_handler_t *, void *)");
  }
  if (parser->read_handler == (yaml_read_handler_t *)0x0) {
    if (handler != (yaml_read_handler_t *)0x0) {
      parser->read_handler = handler;
      parser->read_handler_data = data;
      return;
    }
    __assert_fail("handler",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x14b,
                  "void yaml_parser_set_input(yaml_parser_t *, yaml_read_handler_t *, void *)");
  }
  __assert_fail("!parser->read_handler",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                ,0x14a,"void yaml_parser_set_input(yaml_parser_t *, yaml_read_handler_t *, void *)")
  ;
}

Assistant:

YAML_DECLARE(void)
yaml_parser_set_input(yaml_parser_t *parser,
        yaml_read_handler_t *handler, void *data)
{
    assert(parser); /* Non-NULL parser object expected. */
    assert(!parser->read_handler);  /* You can set the source only once. */
    assert(handler);    /* Non-NULL read handler expected. */

    parser->read_handler = handler;
    parser->read_handler_data = data;
}